

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O2

void process_files(GSList *files,scan_opts *opts)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  int started;
  
  started = 0;
  g_mutex_lock(&progress_mutex);
  uVar1 = g_thread_new(0,print_progress_bar,&started);
  while (started == 0) {
    g_cond_wait(&progress_cond,&progress_mutex);
  }
  g_mutex_unlock(&progress_mutex);
  iVar2 = nproc();
  uVar3 = g_thread_pool_new(init_state_and_scan_work_item,opts,iVar2,0,0);
  g_slist_foreach(files,init_state_and_scan,uVar3);
  g_thread_pool_free(uVar3,0,1);
  g_thread_join(uVar1);
  return;
}

Assistant:

void
process_files(GSList *files, struct scan_opts *opts)
{
	GThreadPool *pool;
	GThread *progress_bar_thread;

	int started = 0;

	// Start the progress bar thread. It misuses progress_mutex and
	// progress_cond to signal when it is ready.
	g_mutex_lock(&progress_mutex);
	progress_bar_thread = g_thread_new(NULL, print_progress_bar, &started);
	while (!started) {
		g_cond_wait(&progress_cond, &progress_mutex);
	}
	g_mutex_unlock(&progress_mutex);

	pool = g_thread_pool_new((GFunc)init_state_and_scan_work_item, opts,
	    nproc(), FALSE, NULL);
	g_slist_foreach(files, (GFunc)init_state_and_scan, pool);
	g_thread_pool_free(pool, FALSE, TRUE);
	g_thread_join(progress_bar_thread);
}